

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int sort_5_3::merge_sort_4(int *a,int low,int high)

{
  long lVar1;
  int extraout_EDX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined *puVar5;
  string *this;
  int iVar6;
  allocator aStack_59;
  string sStack_58;
  string sStack_38;
  code *pcStack_18;
  
  merge_sort_4(a,low,(high + low) / 2);
  pcStack_18 = (code *)0x103132;
  ps_int((int *)&DAT_00104160,10);
  puVar5 = &DAT_00104160;
  uVar4 = 0;
  pcStack_18 = test_5_3_1::del_hash;
  merge_sort_4((int *)&DAT_00104160,0,9);
  pcStack_18 = (code *)&DAT_00104160;
  iVar3 = (int)uVar4;
  iVar2 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 7);
  if (*(int *)(puVar5 + (long)iVar2 * 4) == iVar3) {
    std::__cxx11::string::string((string *)&sStack_38,anon_var_dwarf_21f9,&aStack_59);
    iVar2 = 1;
    errCode(&sStack_38,1);
    this = &sStack_38;
LAB_001031d5:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    iVar6 = 1;
    do {
      if (extraout_EDX <= iVar6) {
        std::__cxx11::string::string((string *)&sStack_58,anon_var_dwarf_21ee,&aStack_59);
        iVar2 = 0;
        errCode(&sStack_58,0);
        this = &sStack_58;
        goto LAB_001031d5;
      }
      lVar1 = (long)((iVar2 + iVar6) % 7);
      iVar6 = iVar6 + 1;
    } while (*(int *)(puVar5 + lVar1 * 4) != iVar3);
    *(undefined4 *)(puVar5 + lVar1 * 4) = 0xffffffff;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int merge_sort_4(int *a, int low, int high) {
        if (low < high) {
            int m = (low + high) / 2;
            merge_sort_4(a, low, m);
            merge_sort_4(a, m + 1, high);
            merge_4(a, low, high, m);
        }
    }